

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headlossmodel.cpp
# Opt level: O0

void __thiscall
CM_HeadLossModel::findHeadLoss
          (CM_HeadLossModel *this,Pipe *pipe,double flow,double *headLoss,double *gradient)

{
  double dVar1;
  double extraout_XMM0_Qa;
  double k;
  double r;
  double q;
  double *gradient_local;
  double *headLoss_local;
  double flow_local;
  Pipe *pipe_local;
  CM_HeadLossModel *this_local;
  
  std::abs((int)this);
  dVar1 = pipe->lossFactor;
  *gradient = pipe->resistance * 2.0 * extraout_XMM0_Qa;
  if (1e-06 < *gradient || *gradient == 1e-06) {
    *headLoss = (extraout_XMM0_Qa * *gradient) / 2.0;
  }
  else {
    *gradient = 1e-06;
    *headLoss = extraout_XMM0_Qa * *gradient;
  }
  if (0.0 < dVar1) {
    *headLoss = dVar1 * extraout_XMM0_Qa * extraout_XMM0_Qa + *headLoss;
    *gradient = dVar1 * 2.0 * extraout_XMM0_Qa + *gradient;
  }
  return;
}

Assistant:

void CM_HeadLossModel::findHeadLoss(
        Pipe* pipe, double flow, double& headLoss, double& gradient)
{
    double q = abs(flow);
    double r = pipe->resistance;
    double k = pipe->lossFactor;

    gradient = 2.0 * r * q;
    if ( gradient < MIN_GRADIENT )
    {
        gradient = MIN_GRADIENT;
        headLoss = q * gradient;
    }
    else headLoss = q * gradient / 2.0;
    if (k > 0.0)
    {
        headLoss += k * q * q;
        gradient += 2.0 * k * q;
   	}
}